

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O0

LngLat mercatortile::ul(Tile *tile)

{
  LngLat LVar1;
  __type _Var2;
  double dVar3;
  double lat_rad;
  double n;
  Tile *tile_local;
  LngLat lonlat;
  
  _Var2 = std::pow<double,int>(2.0,tile->z);
  dVar3 = sinh((1.0 - ((double)tile->y + (double)tile->y) / _Var2) * 3.141592653589793);
  dVar3 = atan(dVar3);
  LVar1.lat = (dVar3 * 180.0) / 3.141592653589793;
  LVar1.lng = ((double)tile->x / _Var2) * 360.0 + -180.0;
  return LVar1;
}

Assistant:

LngLat ul(const Tile &tile)
{
    LngLat lonlat;
    double n = pow(2.0, tile.z);
    double lat_rad = atan(sinh(M_PI * (1.0 - 2.0 * tile.y / n)));
    lonlat.lat = lat_rad * 180.0 / M_PI;
    lonlat.lng = tile.x / n * 360.0 - 180.0;

    return lonlat;
}